

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O2

void I_CloseSound(void)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < S_sfx.Count; uVar2 = uVar2 + 1) {
    S_UnloadSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar1));
    lVar1 = lVar1 + 0x50;
  }
  if (GSnd != (SoundRenderer *)0x0) {
    (*GSnd->_vptr_SoundRenderer[1])();
  }
  GSnd = (SoundRenderer *)0x0;
  return;
}

Assistant:

void I_CloseSound ()
{
	// Free all loaded samples
	for (unsigned i = 0; i < S_sfx.Size(); i++)
	{
		S_UnloadSound(&S_sfx[i]);
	}

	delete GSnd;
	GSnd = NULL;
}